

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O3

void Exa_ManExactSynthesis2(Bmc_EsPar_t *pPars)

{
  ulong *puVar1;
  uint uVar2;
  word wVar3;
  lit *begin;
  void *__ptr;
  undefined1 auVar4 [16];
  Bmc_EsPar_t *pBVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined8 *__ptr_00;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar9;
  int *piVar10;
  void *pvVar11;
  sat_solver *s;
  long lVar12;
  undefined8 uVar13;
  timespec *ptVar14;
  int nWords;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long *end;
  byte bVar19;
  undefined8 *puVar20;
  uint uVar21;
  char *pcVar22;
  uint uVar23;
  long lVar24;
  bool bVar25;
  long lVar26;
  ulong uVar27;
  undefined8 *puVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar44;
  int iMint;
  timespec ts;
  word pTruth [16];
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  uint local_1bc;
  undefined8 *local_1b8;
  timespec local_1b0;
  uint local_19c;
  undefined8 *local_198;
  ulong local_190;
  ulong local_188;
  Bmc_EsPar_t *local_180;
  int local_178;
  int local_174;
  undefined8 *local_170;
  uint local_164;
  long local_160;
  timespec local_158 [8];
  ulong local_d8;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8 [17];
  
  local_1bc = 1;
  local_180 = pPars;
  iVar6 = clock_gettime(3,local_158);
  pBVar5 = local_180;
  if (iVar6 < 0) {
    local_160 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_158[0].tv_nsec._4_4_,(uint)local_158[0].tv_nsec)),8);
    local_160 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) +
                CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec) * -1000000;
  }
  Abc_TtReadHex(local_b8,local_180->pTtStr);
  iVar6 = pBVar5->nVars;
  lVar16 = (long)iVar6;
  if (10 < lVar16) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x35a,"void Exa_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  __ptr_00 = (undefined8 *)calloc(1,0x20c0);
  *__ptr_00 = pBVar5;
  *(int *)(__ptr_00 + 1) = iVar6;
  iVar30 = pBVar5->nNodes;
  *(int *)((long)__ptr_00 + 0xc) = iVar30;
  iVar29 = iVar30 + iVar6;
  *(int *)(__ptr_00 + 2) = iVar29;
  iVar15 = 1 << ((char)iVar6 - 6U & 0x1f);
  if (iVar6 < 7) {
    iVar15 = 1;
  }
  *(int *)((long)__ptr_00 + 0x14) = iVar15;
  __ptr_00[4] = local_b8;
  p = (Vec_Wec_t *)malloc(0x10);
  iVar15 = 8;
  if (6 < (iVar6 + iVar30) - 1U) {
    iVar15 = iVar29;
  }
  p->nCap = iVar15;
  if (iVar15 == 0) {
    pVVar9 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar9 = (Vec_Int_t *)calloc((long)iVar15,0x10);
  }
  p->pArray = pVVar9;
  p->nSize = iVar29;
  __ptr_00[0x416] = p;
  if (0x20 < iVar29) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x22e,"int Exa_ManMarkup(Exa_Man_t *)");
  }
  iVar6 = iVar30 * 3 + 1;
  *(int *)(__ptr_00 + 3) = iVar6;
  if (0 < iVar30) {
    local_1b0.tv_nsec = (long)(__ptr_00 + 6);
    local_1d0 = __ptr_00 + lVar16 * 0x20 + 6;
    do {
      local_1b8 = (undefined8 *)(local_1b0.tv_nsec + lVar16 * 0x20 * 8);
      uVar31 = 0;
      bVar36 = true;
      do {
        bVar25 = bVar36;
        if (local_180->fFewerVars == 0) {
LAB_005af5e4:
          uVar17 = 0;
          if (local_180->fFewerVars != 0) {
            uVar17 = uVar31 ^ 1;
          }
          if ((long)uVar17 < (long)(lVar16 - uVar31)) {
            do {
              iVar6 = *(int *)(__ptr_00 + 3);
              if (iVar6 < 0) goto LAB_005b064d;
              Vec_WecPush(p,(int)uVar17,iVar6 * 2);
              *(int *)(__ptr_00 + 3) = iVar6 + 1;
              *(int *)((long)local_1d0 + uVar17 * 4 + uVar31 * 0x80) = iVar6;
              uVar17 = uVar17 + 1;
            } while ((long)uVar17 < (long)(lVar16 - uVar31));
          }
        }
        else {
          iVar6 = *(int *)(__ptr_00 + 2);
          if ((bool)(~bVar25 & 1U | iVar6 + -1 != (int)lVar16)) goto LAB_005af5e4;
          iVar30 = *(int *)(__ptr_00 + 3);
          if (iVar30 < 0) goto LAB_005b064d;
          Vec_WecPush(p,iVar6 + -2,iVar30 * 2);
          *(int *)(__ptr_00 + 3) = iVar30 + 1;
          *(int *)((long)local_1b8 + (long)iVar6 * 4 + -8) = iVar30;
        }
        uVar31 = 1;
        bVar36 = false;
      } while (bVar25);
      lVar16 = lVar16 + 1;
      iVar29 = *(int *)(__ptr_00 + 2);
      local_1d0 = local_1d0 + 0x20;
    } while (lVar16 < iVar29);
    iVar6 = *(int *)(__ptr_00 + 3);
  }
  pvVar11 = (void *)0x0;
  printf("The number of parameter variables = %d.\n");
  lVar16 = (long)*(int *)((long)__ptr_00 + 0x14);
  lVar35 = ((long)iVar29 + 1) * lVar16;
  piVar10 = (int *)malloc(0x10);
  iVar30 = (int)lVar35;
  iVar29 = 0x10;
  if (0xe < iVar30 - 1U) {
    iVar29 = iVar30;
  }
  *piVar10 = iVar29;
  if (iVar29 != 0) {
    pvVar11 = malloc((long)iVar29 << 3);
  }
  *(void **)(piVar10 + 2) = pvVar11;
  piVar10[1] = iVar30;
  memset(pvVar11,0,lVar35 * 8);
  auVar38 = _DAT_0094e260;
  auVar39 = _DAT_0094e250;
  auVar4 = _DAT_0094e240;
  uVar7 = *(uint *)(__ptr_00 + 1);
  if (0 < (long)(int)uVar7) {
    uVar31 = (ulong)(uint)(1 << ((char)uVar7 - 6U & 0x1f));
    if (uVar7 < 7) {
      uVar31 = 1;
    }
    iVar30 = (int)uVar31;
    lVar26 = uVar31 - 1;
    auVar37._8_4_ = (int)lVar26;
    auVar37._0_8_ = lVar26;
    auVar37._12_4_ = (int)((ulong)lVar26 >> 0x20);
    lVar26 = (long)pvVar11 + 8;
    uVar31 = 0;
    auVar37 = auVar37 ^ _DAT_0094e250;
    do {
      if (((long)(uVar31 * lVar16) < 0) || (lVar35 <= (long)(uVar31 * lVar16))) goto LAB_005b09a9;
      iVar29 = auVar37._0_4_;
      iVar15 = auVar37._4_4_;
      lVar12 = auVar38._0_8_;
      lVar40 = auVar38._8_8_;
      if (uVar31 < 6) {
        if (0 < iVar30) {
          wVar3 = s_Truths6[uVar31];
          lVar24 = 0;
          auVar43 = auVar4;
          do {
            auVar42 = auVar43 ^ auVar39;
            bVar36 = iVar29 < auVar42._0_4_;
            iVar44 = auVar42._4_4_;
            if ((bool)(~(iVar15 < iVar44 || iVar44 == iVar15 && bVar36) & 1)) {
              *(word *)(lVar26 + -8 + lVar24) = wVar3;
            }
            if (iVar15 >= iVar44 && (iVar44 != iVar15 || !bVar36)) {
              *(word *)(lVar26 + lVar24) = wVar3;
            }
            lVar41 = auVar43._8_8_;
            auVar43._0_8_ = auVar43._0_8_ + lVar12;
            auVar43._8_8_ = lVar41 + lVar40;
            lVar24 = lVar24 + 0x10;
          } while ((ulong)(iVar30 + 1U >> 1) << 4 != lVar24);
        }
      }
      else if (0 < iVar30) {
        uVar34 = 1 << ((char)uVar31 - 6U & 0x1f);
        uVar17 = 0;
        auVar42 = auVar4;
        do {
          auVar43 = auVar42 ^ auVar39;
          bVar36 = iVar29 < auVar43._0_4_;
          iVar44 = auVar43._4_4_;
          if ((iVar15 < iVar44 || iVar44 == iVar15 && bVar36) != true) {
            *(ulong *)(lVar26 + -8 + uVar17 * 8) = -(ulong)((uVar34 & (uint)uVar17) != 0);
          }
          if (iVar15 >= iVar44 && (iVar44 != iVar15 || !bVar36)) {
            *(ulong *)(lVar26 + uVar17 * 8) = -(ulong)(((uint)uVar17 + 1 & uVar34) != 0);
          }
          uVar17 = uVar17 + 2;
          lVar24 = auVar42._8_8_;
          auVar42._0_8_ = auVar42._0_8_ + lVar12;
          auVar42._8_8_ = lVar24 + lVar40;
        } while ((iVar30 + 1U & 0xfffffffe) != uVar17);
      }
      uVar31 = uVar31 + 1;
      lVar26 = lVar26 + lVar16 * 8;
    } while (uVar31 != (long)(int)uVar7);
  }
  __ptr_00[5] = piVar10;
  s = sat_solver_new();
  __ptr_00[0x417] = s;
  sat_solver_setnvars(s,iVar6);
  local_c0 = local_b8[0];
  if (((local_b8[0] & 1) != 0) && (iVar6 = *(int *)((long)__ptr_00 + 0x14), 0 < (long)iVar6)) {
    lVar16 = 0;
    do {
      local_b8[lVar16] = ~local_b8[lVar16];
      lVar16 = lVar16 + 1;
    } while (iVar6 != lVar16);
  }
  uVar17 = (ulong)*(int *)(__ptr_00 + 1);
  uVar7 = *(uint *)(__ptr_00 + 2);
  uVar31 = (ulong)uVar7;
  if (*(int *)(__ptr_00 + 1) < (int)uVar7) {
    local_19c = local_180->fOnlyAnd;
    local_170 = __ptr_00 + 6;
    local_198 = __ptr_00 + uVar17 * 0x20 + 6;
    local_1b0.tv_nsec = (long)(__ptr_00 + uVar17 * 0x20 + 0x16);
LAB_005af94b:
    puVar28 = local_170;
    local_188 = uVar17;
    if ((int)uVar31 < 1) {
LAB_005b09c8:
      __assert_fail("nLits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x2dd,"int Exa_ManAddCnfStart(Exa_Man_t *, int)");
    }
    local_190 = (ulong)(uint)((int)uVar17 - *(int *)(__ptr_00 + 1));
    local_1d0 = (undefined8 *)0x0;
    puVar20 = local_198;
    do {
      uVar18 = 0;
      uVar7 = 0;
      do {
        iVar6 = *(int *)((long)puVar20 + uVar18 * 4);
        if (iVar6 != 0) {
          if (iVar6 < 0) goto LAB_005b064d;
          lVar16 = (long)(int)uVar7;
          uVar7 = uVar7 + 1;
          *(int *)((long)&local_158[0].tv_sec + lVar16 * 4) = iVar6 * 2;
        }
        uVar18 = uVar18 + 1;
      } while ((uVar31 & 0xffffffff) != uVar18);
      if ((int)uVar7 < 1) goto LAB_005b09c8;
      uVar31 = (ulong)uVar7;
      local_1b8 = puVar20;
      iVar6 = sat_solver_addclause
                        ((sat_solver *)__ptr_00[0x417],(lit *)local_158,
                         (lit *)((long)&local_158[0].tv_sec + uVar31 * 4));
      if (iVar6 == 0) goto LAB_005b062e;
      ptVar14 = local_158;
      uVar18 = uVar31;
      uVar32 = 0;
      do {
        uVar33 = uVar32 + 1;
        if (uVar33 < uVar31) {
          uVar27 = 1;
          do {
            uVar7 = *(uint *)((long)&local_158[0].tv_sec + uVar32 * 4);
            if ((int)uVar7 < 0) {
LAB_005b060f:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            local_1b0.tv_sec._0_4_ = uVar7 ^ 1;
            uVar7 = *(uint *)((long)&ptVar14->tv_sec + uVar27 * 4);
            if ((int)uVar7 < 0) goto LAB_005b060f;
            local_1b0.tv_sec._4_4_ = uVar7 ^ 1;
            iVar6 = sat_solver_addclause
                              ((sat_solver *)__ptr_00[0x417],(lit *)&local_1b0,
                               (lit *)&local_1b0.tv_nsec);
            if (iVar6 == 0) goto LAB_005b062e;
            uVar27 = uVar27 + 1;
          } while (uVar18 != uVar27);
        }
        uVar18 = uVar18 - 1;
        ptVar14 = (timespec *)((long)&ptVar14->tv_sec + 4);
        uVar32 = uVar33;
      } while (uVar33 != uVar31);
      if (local_1d0 == (undefined8 *)0x1) goto LAB_005afb3a;
      uVar31 = (ulong)*(uint *)(__ptr_00 + 2);
      if ((int)*(uint *)(__ptr_00 + 2) < 1) goto LAB_005b09c8;
      lVar16 = 0;
      puVar20 = (undefined8 *)local_1b0.tv_nsec;
      do {
        lVar35 = (long)(int)uVar31;
        if ((lVar16 < lVar35) && (*(int *)((long)puVar28 + lVar16 * 4 + uVar17 * 0x100) != 0)) {
          lVar35 = 0;
          do {
            iVar6 = *(int *)((long)puVar20 + lVar35 * 4);
            if (iVar6 != 0) {
              iVar30 = *(int *)((long)puVar28 + lVar16 * 4 + uVar17 * 0x100);
              if ((iVar30 < 0) || (local_1b0.tv_sec._0_4_ = iVar30 * 2 + 1, iVar6 < 0))
              goto LAB_005b064d;
              local_1b0.tv_sec._4_4_ = iVar6 * 2 + 1;
              iVar6 = sat_solver_addclause
                                ((sat_solver *)__ptr_00[0x417],(lit *)&local_1b0,
                                 (lit *)&local_1b0.tv_nsec);
              if (iVar6 == 0) goto LAB_005b062e;
              uVar31 = (ulong)*(uint *)(__ptr_00 + 2);
            }
            lVar35 = lVar35 + 1;
          } while ((int)lVar35 + (int)lVar16 < (int)uVar31);
          lVar35 = (long)(int)uVar31;
        }
        lVar16 = lVar16 + 1;
        puVar20 = (undefined8 *)((long)puVar20 + 4);
      } while (lVar16 < lVar35);
      local_1d0 = (undefined8 *)((long)local_1d0 + 1);
      puVar20 = local_1b8 + 0x10;
      if ((int)uVar31 < 1) goto LAB_005b09c8;
    } while( true );
  }
LAB_005afc3f:
  if (1 < (int)uVar7) {
    lVar16 = 8;
    lVar35 = 0;
    do {
      if (*(int *)(__ptr_00[0x416] + 4) <= lVar35) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar26 = *(long *)(__ptr_00[0x416] + 8);
      lVar12 = (long)*(int *)(lVar26 + -4 + lVar16);
      if (lVar12 < 1) {
        __assert_fail("Vec_IntSize(vArray) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                      ,0x317,"int Exa_ManAddCnfStart(Exa_Man_t *, int)");
      }
      begin = *(lit **)(lVar26 + lVar16);
      iVar6 = sat_solver_addclause((sat_solver *)__ptr_00[0x417],begin,begin + lVar12);
      if (iVar6 == 0) {
LAB_005b062e:
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                      ,0x35e,"void Exa_ManExactSynthesis2(Bmc_EsPar_t *)");
      }
      lVar35 = lVar35 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar35 < (long)*(int *)(__ptr_00 + 2) + -1);
  }
  printf("Running exact synthesis for %d-input function with %d two-input gates...\n",
         (ulong)*(uint *)(__ptr_00 + 1),(ulong)*(uint *)((long)__ptr_00 + 0xc));
  if (local_1bc != 0xffffffff) {
    local_1b0.tv_nsec = (long)(__ptr_00 + 6);
    local_188 = local_188 & 0xffffffff00000000;
    do {
      iVar6 = clock_gettime(3,local_158);
      auVar4 = _DAT_0094e250;
      if (iVar6 < 0) {
        lVar16 = 1;
      }
      else {
        lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                        SEXT816(CONCAT44(local_158[0].tv_nsec._4_4_,(uint)local_158[0].tv_nsec)),8);
        lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) +
                 CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec) * -1000000;
      }
      uVar17 = (ulong)local_1bc;
      uVar31 = *(ulong *)(__ptr_00[4] + (long)((int)local_1bc >> 6) * 8);
      iVar6 = *(int *)(__ptr_00 + 1);
      if (0 < (long)iVar6) {
        lVar35 = (long)iVar6 + -1;
        auVar38._8_4_ = (int)lVar35;
        auVar38._0_8_ = lVar35;
        auVar38._12_4_ = (int)((ulong)lVar35 >> 0x20);
        auVar38 = auVar38 ^ _DAT_0094e250;
        uVar18 = 0;
        auVar39 = _DAT_0094e240;
        do {
          bVar36 = auVar38._0_4_ < SUB164(auVar39 ^ auVar4,0);
          iVar30 = auVar38._4_4_;
          iVar29 = SUB164(auVar39 ^ auVar4,4);
          if ((bool)(~(iVar30 < iVar29 || iVar29 == iVar30 && bVar36) & 1)) {
            *(uint *)((long)__ptr_00 + uVar18 * 4 + 0x2030) =
                 (uint)((local_1bc >> ((uint)uVar18 & 0x1f) & 1) != 0);
          }
          if (iVar30 >= iVar29 && (iVar29 != iVar30 || !bVar36)) {
            *(uint *)((long)__ptr_00 + uVar18 * 4 + 0x2034) =
                 (uint)((local_1bc >> ((uint)uVar18 + 1 & 0x1f) & 1) != 0);
          }
          uVar18 = uVar18 + 2;
          lVar35 = auVar39._8_8_;
          auVar39._0_8_ = auVar39._0_8_ + 2;
          auVar39._8_8_ = lVar35 + 2;
        } while ((iVar6 + 1U & 0xfffffffe) != uVar18);
      }
      sat_solver_setnvars((sat_solver *)__ptr_00[0x417],
                          *(int *)((long)__ptr_00 + 0xc) * 3 + *(int *)(__ptr_00 + 3));
      iVar6 = *(int *)(__ptr_00 + 1);
      puVar28 = (undefined8 *)(long)iVar6;
      uVar18 = (ulong)*(uint *)(__ptr_00 + 2);
      if (iVar6 < (int)*(uint *)(__ptr_00 + 2)) {
        local_174 = iVar6 * 6;
        local_178 = iVar6 * 3;
        local_19c = (uint)((uVar31 >> (uVar17 & 0x3f) & 1) != 0);
        local_d0 = lVar16;
        do {
          local_c8 = (ulong)*(uint *)(__ptr_00 + 1);
          lVar16 = (long)(int)((int)puVar28 - *(uint *)(__ptr_00 + 1)) * 3;
          local_1b8 = (undefined8 *)(*(int *)(__ptr_00 + 3) + lVar16);
          uVar13 = CONCAT71((int7)((ulong)lVar16 >> 8),1);
          uVar31 = 0;
          local_170 = puVar28;
          do {
            local_198 = (undefined8 *)CONCAT44(local_198._4_4_,(int)uVar13);
            if (0 < (int)uVar18) {
              lVar16 = uVar31 + (long)local_1b8;
              lVar35 = 0;
              local_190 = uVar31;
              do {
                lVar26 = uVar31 * 0x80 + (long)puVar28 * 0x100;
                if (*(int *)(local_1b0.tv_nsec + lVar35 * 4 + lVar26) != 0) {
                  iVar6 = ((int)lVar35 - *(int *)(__ptr_00 + 1)) * 3 + *(int *)(__ptr_00 + 3);
                  piVar10 = (int *)(local_1b0.tv_nsec + lVar35 * 4 + lVar26);
                  uVar7 = 0;
                  bVar36 = true;
                  do {
                    bVar25 = bVar36;
                    iVar30 = *piVar10;
                    if ((iVar30 < 0) || (local_158[0].tv_sec._0_4_ = iVar30 * 2 + 1, lVar16 < 0))
                    goto LAB_005b064d;
                    local_158[0].tv_sec._4_4_ = uVar7 | (int)lVar16 * 2;
                    if (lVar35 < *(int *)(__ptr_00 + 1)) {
                      end = &local_158[0].tv_nsec;
                      if (*(uint *)((long)__ptr_00 + lVar35 * 4 + 0x2030) != uVar7)
                      goto LAB_005aff5a;
                    }
                    else {
                      if (iVar6 < -2) goto LAB_005b064d;
                      local_158[0].tv_nsec._0_4_ = (uVar7 | iVar6 * 2 + 4U) ^ 1;
                      end = (long *)((long)&local_158[0].tv_nsec + 4);
LAB_005aff5a:
                      iVar30 = sat_solver_addclause
                                         ((sat_solver *)__ptr_00[0x417],(lit *)local_158,(lit *)end)
                      ;
                      if (iVar30 == 0) goto LAB_005b067d;
                    }
                    uVar7 = 1;
                    bVar36 = false;
                  } while (bVar25);
                  uVar18 = (ulong)*(uint *)(__ptr_00 + 2);
                  uVar31 = local_190;
                  puVar28 = local_170;
                }
                lVar35 = lVar35 + 1;
              } while (lVar35 < (int)uVar18);
            }
            uVar31 = 1;
            uVar7 = 0;
            uVar13 = 0;
          } while (((ulong)local_198 & 1) != 0);
          iVar6 = (int)local_1b8;
          local_164 = iVar6 * 2 + 4;
          iVar30 = (int)local_c8;
          local_d8 = (ulong)(uint)(local_174 + iVar30 * -6);
          local_198 = (undefined8 *)CONCAT44(local_198._4_4_,local_178 + iVar30 * -3);
          uVar13 = CONCAT71((uint7)(uint3)((uint)(iVar30 * 3) >> 8),1);
          bVar19 = 0;
          do {
            local_190 = CONCAT44(local_190._4_4_,(int)uVar13);
            if ((*(int *)(__ptr_00 + 2) + -1 != (int)puVar28) || (uVar7 != local_19c)) {
              iVar30 = (int)local_d8 + uVar7;
              uVar7 = uVar7 | local_164;
              uVar31 = 0;
              do {
                uVar34 = (uint)uVar31;
                if (!(bool)(bVar19 & uVar34 == 0)) {
                  if ((int)local_1b8 < 0) goto LAB_005b064d;
                  local_158[0].tv_sec._0_4_ = uVar34 & 1 | iVar6 * 2;
                  local_158[0].tv_sec._4_4_ = (int)(uVar31 >> 1) + iVar6 * 2 + 2;
                  uVar8 = 2;
                  if (*(int *)(__ptr_00 + 2) + -1 != (int)puVar28) {
                    uVar8 = 3;
                    local_158[0].tv_nsec._0_4_ = uVar7 ^ 1;
                  }
                  if (uVar34 != 0) {
                    if ((int)((int)local_198 + uVar34) < 0) goto LAB_005b064d;
                    uVar31 = (ulong)uVar8;
                    uVar8 = uVar8 + 1;
                    *(int *)((long)&local_158[0].tv_sec + uVar31 * 4) = iVar30;
                  }
                  iVar29 = sat_solver_addclause
                                     ((sat_solver *)__ptr_00[0x417],(lit *)local_158,
                                      (lit *)((long)&local_158[0].tv_sec + (ulong)uVar8 * 4));
                  if (iVar29 == 0) goto LAB_005b067d;
                }
                uVar31 = (ulong)(uVar34 + 1);
                iVar30 = iVar30 + 2;
              } while (uVar34 + 1 != 4);
            }
            uVar7 = 1;
            bVar19 = 1;
            uVar13 = 0;
          } while ((local_190 & 1) != 0);
          puVar28 = (undefined8 *)((long)puVar28 + 1);
          uVar18 = (ulong)*(int *)(__ptr_00 + 2);
          local_174 = local_174 + 6;
          local_178 = local_178 + 3;
          lVar16 = local_d0;
        } while ((long)puVar28 < (long)uVar18);
      }
      *(int *)(__ptr_00 + 3) = *(int *)(__ptr_00 + 3) + *(int *)((long)__ptr_00 + 0xc) * 3;
      iVar6 = sat_solver_solve((sat_solver *)__ptr_00[0x417],(lit *)0x0,(lit *)0x0,0,0,0,0);
      if (local_180->fVerbose != 0) {
        printf("Iter %3d : ",local_188 & 0xffffffff);
        Extra_PrintBinary(_stdout,&local_1bc,*(int *)(__ptr_00 + 1));
        printf("  Var =%5d  ",(ulong)*(uint *)(__ptr_00 + 3));
        uVar7 = sat_solver_nclauses((sat_solver *)__ptr_00[0x417]);
        printf("Cla =%6d  ",(ulong)uVar7);
        uVar7 = sat_solver_nconflicts((sat_solver *)__ptr_00[0x417]);
        printf("Conf =%9d  ",(ulong)uVar7);
        iVar29 = 3;
        iVar30 = clock_gettime(3,local_158);
        if (iVar30 < 0) {
          lVar35 = -1;
        }
        else {
          lVar35 = CONCAT44(local_158[0].tv_nsec._4_4_,(uint)local_158[0].tv_nsec) / 1000 +
                   CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec) * 1000000;
        }
        Abc_Print(iVar29,"%s =","Time");
        Abc_Print(iVar29,"%9.2f sec\n",(double)(lVar35 + lVar16) / 1000000.0);
      }
      if (iVar6 == -1) {
        puts("The problem has no solution.");
LAB_005b067d:
        if (local_1bc != 0xffffffff) goto LAB_005b0839;
        break;
      }
      uVar7 = *(uint *)(__ptr_00 + 1);
      local_1c8 = (undefined8 *)(long)(int)uVar7;
      uVar34 = *(uint *)(__ptr_00 + 2);
      uVar8 = uVar34;
      if ((int)uVar34 < (int)uVar7) {
        uVar8 = uVar7;
      }
      if ((int)uVar7 < (int)uVar34) {
        if ((int)uVar34 < 1) {
LAB_005b098a:
          __assert_fail("Count == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                        ,0x280,"int Exa_ManFindFanin(Exa_Man_t *, int, int)");
        }
        local_1b8 = (undefined8 *)(long)(int)uVar8;
        puVar28 = (undefined8 *)(local_1b0.tv_nsec + (long)local_1c8 * 0x20 * 8);
        do {
          ptVar14 = local_158;
          lVar35 = 0;
          bVar36 = true;
          do {
            bVar25 = bVar36;
            uVar17 = 0;
            uVar31 = 0xffffffff;
            iVar6 = 0;
            do {
              uVar8 = *(uint *)((long)puVar28 + uVar17 * 4 + lVar35 * 0x80);
              if ((ulong)uVar8 != 0) {
                if (((int)uVar8 < 0) || (*(int *)__ptr_00[0x417] <= (int)uVar8)) goto LAB_005b096b;
                bVar36 = *(int *)(*(long *)((int *)__ptr_00[0x417] + 0x52) + (ulong)uVar8 * 4) == 1;
                if (bVar36) {
                  uVar31 = uVar17 & 0xffffffff;
                }
                iVar6 = iVar6 + (uint)bVar36;
              }
              uVar17 = uVar17 + 1;
            } while (uVar34 != uVar17);
            if (iVar6 != 1) goto LAB_005b098a;
            uVar8 = *(uint *)((long)__ptr_00 + 0x14);
            uVar17 = (ulong)uVar8;
            uVar21 = (int)uVar31 * uVar8;
            if ((int)uVar21 < 0) goto LAB_005b09a9;
            lVar16 = __ptr_00[5];
            uVar2 = *(uint *)(lVar16 + 4);
            if ((int)uVar2 <= (int)uVar21) goto LAB_005b09a9;
            lVar26 = *(long *)(lVar16 + 8);
            ptVar14->tv_sec = lVar26 + (ulong)uVar21 * 8;
            lVar35 = 1;
            ptVar14 = &local_1b0;
            bVar36 = false;
          } while (bVar25);
          uVar21 = uVar8 * (int)local_1c8;
          if (((int)uVar21 < 0) || (uVar2 <= uVar21)) goto LAB_005b09a9;
          if (0 < (int)uVar8) {
            memset((void *)(lVar26 + (ulong)uVar21 * 8),0,uVar17 * 8);
          }
          piVar10 = (int *)__ptr_00[0x417];
          uVar21 = uVar8 * uVar34;
          lVar35 = lVar26 + (ulong)uVar21 * 8;
          lVar40 = CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec);
          lVar12 = CONCAT44(local_1b0.tv_sec._4_4_,(uint)local_1b0.tv_sec);
          uVar31 = 1;
          do {
            uVar23 = ((int)local_1c8 - uVar7) * 3 + (int)uVar31;
            if (((int)uVar23 < 0) || (*piVar10 <= (int)uVar23)) goto LAB_005b096b;
            if (*(int *)(*(long *)(piVar10 + 0x52) + (ulong)uVar23 * 4) != 1) goto LAB_005b04c8;
            if ((int)uVar2 <= (int)uVar21 || (int)uVar21 < 0) goto LAB_005b09a9;
            if ((uVar31 & 1) == 0) {
              if (uVar31 < 2) {
                if (0 < (int)uVar8) {
                  uVar18 = 0;
                  do {
                    *(ulong *)(lVar35 + uVar18 * 8) =
                         ~(*(ulong *)(lVar12 + uVar18 * 8) | *(ulong *)(lVar40 + uVar18 * 8));
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                  goto LAB_005b04b0;
                }
              }
              else if (0 < (int)uVar8) {
                uVar18 = 0;
                do {
                  *(ulong *)(lVar35 + uVar18 * 8) =
                       ~*(ulong *)(lVar40 + uVar18 * 8) & *(ulong *)(lVar12 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar17 != uVar18);
LAB_005b04b0:
                if (0 < (int)uVar8) {
                  uVar18 = 0;
                  do {
                    puVar1 = (ulong *)(lVar26 + (ulong)((int)local_1c8 * uVar8) * 8 + uVar18 * 8);
                    *puVar1 = *puVar1 | *(ulong *)(lVar35 + uVar18 * 8);
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
              }
            }
            else if (uVar31 < 2) {
              if (0 < (int)uVar8) {
                uVar18 = 0;
                do {
                  *(ulong *)(lVar35 + uVar18 * 8) =
                       ~*(ulong *)(lVar12 + uVar18 * 8) & *(ulong *)(lVar40 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar17 != uVar18);
                goto LAB_005b04b0;
              }
            }
            else if (0 < (int)uVar8) {
              uVar18 = 0;
              do {
                *(ulong *)(lVar35 + uVar18 * 8) =
                     *(ulong *)(lVar12 + uVar18 * 8) & *(ulong *)(lVar40 + uVar18 * 8);
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
              goto LAB_005b04b0;
            }
LAB_005b04c8:
            uVar31 = uVar31 + 1;
          } while (uVar31 != 4);
          local_1c8 = (undefined8 *)((long)local_1c8 + 1);
          puVar28 = puVar28 + 0x20;
        } while (local_1c8 != local_1b8);
      }
      else {
        uVar8 = *(uint *)((long)__ptr_00 + 0x14);
        lVar16 = __ptr_00[5];
      }
      uVar8 = (uVar34 - 1) * uVar8;
      if (((int)uVar8 < 0) || (*(int *)(lVar16 + 4) <= (int)uVar8)) {
LAB_005b09a9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar34 = 1 << ((byte)uVar7 - 6 & 0x1f);
      if ((int)uVar7 < 7) {
        uVar34 = 1;
      }
      uVar21 = 0xffffffff;
      if (0 < (int)uVar34) {
        iVar6 = 0;
        uVar31 = 0;
        do {
          uVar17 = *(ulong *)((ulong)uVar8 * 8 + *(long *)(lVar16 + 8) + uVar31 * 8);
          uVar18 = *(ulong *)(__ptr_00[4] + uVar31 * 8);
          if (uVar17 != uVar18) {
            uVar18 = uVar18 ^ uVar17;
            bVar36 = (int)uVar18 == 0;
            uVar31 = uVar18 >> 0x20;
            if (!bVar36) {
              uVar31 = uVar18;
            }
            iVar29 = (uint)bVar36 * 0x20;
            iVar30 = iVar29 + 0x10;
            uVar17 = uVar31 >> 0x10;
            if ((short)uVar31 != 0) {
              iVar30 = iVar29;
              uVar17 = uVar31;
            }
            iVar29 = iVar30 + 8;
            uVar31 = uVar17 >> 8;
            if ((char)uVar17 != '\0') {
              iVar29 = iVar30;
              uVar31 = uVar17;
            }
            iVar30 = iVar29 + 4;
            uVar17 = uVar31 >> 4;
            if ((uVar31 & 0xf) != 0) {
              iVar30 = iVar29;
              uVar17 = uVar31;
            }
            uVar34 = (uint)(uVar17 >> 2) & 0x3fffffff;
            iVar29 = iVar30 + 2;
            if ((uVar17 & 3) != 0) {
              uVar34 = (uint)uVar17;
              iVar29 = iVar30;
            }
            uVar21 = ((~uVar34 & 1) + iVar29) - iVar6;
            break;
          }
          uVar31 = uVar31 + 1;
          iVar6 = iVar6 + -0x40;
        } while (uVar34 != uVar31);
      }
      if (1 << ((byte)uVar7 & 0x1f) <= (int)uVar21) {
        __assert_fail("iMint < (1 << p->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                      ,0x29a,"int Exa_ManEval(Exa_Man_t *)");
      }
      local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 1);
      local_1bc = uVar21;
    } while (uVar21 != 0xffffffff);
  }
  printf("Realization of given %d-input function using %d two-input gates:\n",
         (ulong)*(uint *)(__ptr_00 + 1),(ulong)*(uint *)((long)__ptr_00 + 0xc));
  iVar6 = *(int *)(__ptr_00 + 2);
  uVar31 = (ulong)*(uint *)(__ptr_00 + 1);
  if ((int)*(uint *)(__ptr_00 + 1) < iVar6) {
    puVar28 = __ptr_00 + (long)iVar6 * 0x20 + -10;
    uVar17 = (long)iVar6;
    do {
      uVar18 = uVar17 - 1;
      iVar6 = (int)uVar18 - (int)uVar31;
      if (iVar6 < 0) {
LAB_005b096b:
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      uVar34 = iVar6 * 3 + 1;
      uVar7 = *(uint *)__ptr_00[0x417];
      if ((int)uVar7 <= (int)uVar34) goto LAB_005b096b;
      lVar16 = *(long *)((uint *)__ptr_00[0x417] + 0x52);
      bVar36 = *(int *)(lVar16 + (ulong)uVar34 * 4) == 1;
      uVar34 = iVar6 * 3 + 2;
      if (uVar7 <= uVar34) goto LAB_005b096b;
      uVar8 = iVar6 * 3 + 3;
      if (uVar7 <= uVar8) goto LAB_005b096b;
      uVar31 = (ulong)bVar36;
      uVar7 = (uint)(*(int *)(lVar16 + (ulong)uVar34 * 4) == 1);
      uVar34 = (uint)(*(int *)(lVar16 + (ulong)uVar8 * 4) == 1);
      if (((local_c0 & 1) == 0) || (*(int *)(__ptr_00 + 2) != (int)uVar17)) {
        pcVar22 = "%02d = 4\'b%d%d%d0(";
      }
      else {
        uVar34 = uVar34 ^ 1;
        uVar7 = uVar7 ^ 1;
        uVar31 = (ulong)(bVar36 ^ 1);
        pcVar22 = "%02d = 4\'b%d%d%d1(";
      }
      printf(pcVar22,uVar18 & 0xffffffff,(ulong)uVar34,(ulong)uVar7,uVar31);
      lVar16 = 1;
      puVar20 = puVar28;
      do {
        if ((long)*(int *)(__ptr_00 + 2) < 1) goto LAB_005b098a;
        uVar31 = 0;
        uVar17 = 0xffffffff;
        iVar6 = 0;
        do {
          uVar7 = *(uint *)((long)puVar20 + uVar31 * 4);
          if ((ulong)uVar7 != 0) {
            if (((int)uVar7 < 0) || (*(int *)__ptr_00[0x417] <= (int)uVar7)) goto LAB_005b096b;
            bVar36 = *(int *)(*(long *)((int *)__ptr_00[0x417] + 0x52) + (ulong)uVar7 * 4) == 1;
            if (bVar36) {
              uVar17 = uVar31 & 0xffffffff;
            }
            iVar6 = iVar6 + (uint)bVar36;
          }
          uVar31 = uVar31 + 1;
        } while ((long)*(int *)(__ptr_00 + 2) != uVar31);
        if (iVar6 != 1) goto LAB_005b098a;
        iVar6 = (int)uVar17;
        if ((iVar6 < 0) || (*(int *)(__ptr_00 + 1) <= iVar6)) {
          pcVar22 = " %02d";
        }
        else {
          uVar17 = (ulong)(iVar6 + 0x61);
          pcVar22 = " %c";
        }
        printf(pcVar22,uVar17);
        puVar20 = puVar20 + -0x10;
        bVar36 = lVar16 != 0;
        lVar16 = lVar16 + -1;
      } while (bVar36);
      puts(" )");
      uVar31 = (ulong)*(int *)(__ptr_00 + 1);
      puVar28 = puVar28 + -0x20;
      uVar17 = uVar18;
    } while ((long)uVar31 < (long)uVar18);
  }
LAB_005b0839:
  sat_solver_delete((sat_solver *)__ptr_00[0x417]);
  pvVar11 = (void *)__ptr_00[5];
  __ptr = *(void **)((long)pvVar11 + 8);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  free(pvVar11);
  piVar10 = (int *)__ptr_00[0x416];
  iVar6 = *piVar10;
  pvVar11 = *(void **)(piVar10 + 2);
  if (iVar6 < 1) {
    if (pvVar11 == (void *)0x0) goto LAB_005b08bb;
  }
  else {
    lVar16 = 8;
    lVar35 = 0;
    do {
      if (*(void **)((long)pvVar11 + lVar16) != (void *)0x0) {
        free(*(void **)((long)pvVar11 + lVar16));
        pvVar11 = *(void **)(piVar10 + 2);
        *(undefined8 *)((long)pvVar11 + lVar16) = 0;
        iVar6 = *piVar10;
      }
      lVar35 = lVar35 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar35 < iVar6);
  }
  free(pvVar11);
LAB_005b08bb:
  free(piVar10);
  free(__ptr_00);
  iVar30 = 3;
  iVar6 = clock_gettime(3,local_158);
  if (iVar6 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = CONCAT44(local_158[0].tv_nsec._4_4_,(uint)local_158[0].tv_nsec) / 1000 +
             CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec) * 1000000;
  }
  lVar16 = lVar16 + local_160;
  Abc_Print(iVar30,"%s =","Total runtime");
  Abc_Print(iVar30,"%9.2f sec\n",(double)lVar16 / 1000000.0);
  return;
LAB_005afb3a:
  iVar6 = (int)local_190;
  if (iVar6 < 0) {
LAB_005b064d:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar34 = iVar6 * 6 + 2;
  uVar7 = iVar6 * 6 + 6;
  iVar30 = 3;
  do {
    local_158[0].tv_sec._0_4_ = iVar30 == 2 | uVar34;
    local_158[0].tv_sec._4_4_ = (uint)(iVar30 == 1) | iVar6 * 6 + 4U;
    local_158[0].tv_nsec._0_4_ = iVar30 != 3 | uVar7;
    iVar29 = sat_solver_addclause
                       ((sat_solver *)__ptr_00[0x417],(lit *)local_158,
                        (lit *)((long)&local_158[0].tv_nsec + 4));
    if (iVar29 == 0) goto LAB_005b062e;
    iVar30 = iVar30 + -1;
  } while (iVar30 != 0);
  if (local_19c != 0) {
    local_158[0].tv_sec._0_4_ = uVar34 | 1;
    local_158[0].tv_sec._4_4_ = iVar6 * 6 + 5;
    local_158[0].tv_nsec._0_4_ = uVar7;
    iVar6 = sat_solver_addclause
                      ((sat_solver *)__ptr_00[0x417],(lit *)local_158,
                       (lit *)((long)&local_158[0].tv_nsec + 4));
    if (iVar6 == 0) goto LAB_005b062e;
  }
  uVar17 = local_188 + 1;
  uVar7 = *(uint *)(__ptr_00 + 2);
  uVar31 = (ulong)(int)uVar7;
  local_198 = local_198 + 0x20;
  local_1b0.tv_nsec = local_1b0.tv_nsec + 0x100;
  if ((long)uVar31 <= (long)uVar17) goto LAB_005afc3f;
  goto LAB_005af94b;
}

Assistant:

void Exa_ManExactSynthesis2( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    p = Exa_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d two-input gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Exa_ManAddCnf( p, iMint ) )
            break;
        status = sat_solver_solve( p->pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( pPars->fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", sat_solver_nclauses(p->pSat) );
            printf( "Conf =%9d  ", sat_solver_nconflicts(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == l_False )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Exa_ManEval( p );
    }
    if ( iMint == -1 )
        Exa_ManPrintSolution( p, fCompl );
    Exa_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}